

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec_asn1.cc
# Opt level: O1

int integers_equal(CBS *bytes,BIGNUM *bn)

{
  uint8_t uVar1;
  int iVar2;
  CBS copy;
  uint8_t buf [66];
  CBS local_68;
  uint8_t local_58 [72];
  
  local_68.data = bytes->data;
  local_68.len = bytes->len;
  if (local_68.len != 0) {
    uVar1 = *local_68.data;
    while ((uVar1 == '\0' && (CBS_skip(&local_68,1), local_68.len != 0))) {
      uVar1 = *local_68.data;
    }
  }
  iVar2 = 0;
  if (local_68.len < 0x43) {
    iVar2 = BN_bn2bin_padded(local_58,local_68.len,bn);
    if (iVar2 == 0) {
      ERR_clear_error();
      iVar2 = 0;
    }
    else {
      iVar2 = CBS_mem_equal(&local_68,local_58,local_68.len);
    }
  }
  return iVar2;
}

Assistant:

static int integers_equal(const CBS *bytes, const BIGNUM *bn) {
  // Although, in SEC 1, Field-Element-to-Octet-String has a fixed width,
  // OpenSSL mis-encodes the |a| and |b|, so we tolerate any number of leading
  // zeros. (This matters for P-521 whose |b| has a leading 0.)
  CBS copy = *bytes;
  while (CBS_len(&copy) > 0 && CBS_data(&copy)[0] == 0) {
    CBS_skip(&copy, 1);
  }

  if (CBS_len(&copy) > EC_MAX_BYTES) {
    return 0;
  }
  uint8_t buf[EC_MAX_BYTES];
  if (!BN_bn2bin_padded(buf, CBS_len(&copy), bn)) {
    ERR_clear_error();
    return 0;
  }

  return CBS_mem_equal(&copy, buf, CBS_len(&copy));
}